

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O1

void __thiscall vkt::shaderexecutor::Functions::Sign::Sign(Sign *this)

{
  long *local_38;
  long local_30;
  long local_28 [2];
  
  local_38 = local_28;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"sign","");
  (this->super_PreciseFunc1).super_CFloatFunc1.super_FloatFunc1.
  super_PrimitiveFunc<vkt::shaderexecutor::Signature<float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  .
  super_Func<vkt::shaderexecutor::Signature<float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  .super_FuncBase._vptr_FuncBase = (_func_int **)&PTR__CFloatFunc1_00d41458;
  (this->super_PreciseFunc1).super_CFloatFunc1.m_name._M_dataplus._M_p =
       (pointer)&(this->super_PreciseFunc1).super_CFloatFunc1.m_name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->super_PreciseFunc1).super_CFloatFunc1.m_name,local_38,
             local_30 + (long)local_38);
  (this->super_PreciseFunc1).super_CFloatFunc1.m_func = deSign;
  (this->super_PreciseFunc1).super_CFloatFunc1.super_FloatFunc1.
  super_PrimitiveFunc<vkt::shaderexecutor::Signature<float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  .
  super_Func<vkt::shaderexecutor::Signature<float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  .super_FuncBase._vptr_FuncBase = (_func_int **)&PTR__CFloatFunc1_00d424e8;
  if (local_38 != local_28) {
    operator_delete(local_38,local_28[0] + 1);
  }
  (this->super_PreciseFunc1).super_CFloatFunc1.super_FloatFunc1.
  super_PrimitiveFunc<vkt::shaderexecutor::Signature<float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  .
  super_Func<vkt::shaderexecutor::Signature<float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  .super_FuncBase._vptr_FuncBase = (_func_int **)&PTR__CFloatFunc1_00d45438;
  return;
}

Assistant:

Sign (void) : PreciseFunc1("sign", deSign) {}